

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeFloat16Constant(Builder *this,float f16,bool specConstant)

{
  uint16_t uVar1;
  Op opcode_00;
  Id IVar2;
  Id IVar3;
  Instruction *this_00;
  mapped_type *this_01;
  key_type local_54;
  value_type local_50;
  pointer local_48;
  Instruction *c;
  Id existing;
  FloatProxy<spvutils::Float16> local_34;
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  local_32;
  uint value;
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  f16Val;
  HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
  fVal;
  Id typeId;
  Op opcode;
  bool specConstant_local;
  float f16_local;
  Builder *this_local;
  
  opcode_00 = OpConstant;
  if (specConstant) {
    opcode_00 = OpSpecConstant;
  }
  IVar2 = makeFloatType(this,0x10);
  spvutils::FloatProxy<float>::FloatProxy((FloatProxy<float> *)&value,f16);
  spvutils::
  HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>::
  HexFloat((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
            *)&stack0xffffffffffffffd4,(FloatProxy<float>)value);
  spvutils::FloatProxy<spvutils::Float16>::FloatProxy(&local_34,0);
  spvutils::
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  ::HexFloat(&local_32,local_34);
  spvutils::
  HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>::
  castTo<spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>,spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>>>>
            ((HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>
              *)&stack0xffffffffffffffd4,&local_32,kRoundToZero);
  c._4_2_ = spvutils::
            HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
            ::value(&local_32);
  spvutils::FloatProxy<spvutils::Float16>::getAsFloat
            ((FloatProxy<spvutils::Float16> *)((long)&c + 6));
  uVar1 = spvutils::Float16::get_value((Float16 *)((long)&c + 6));
  existing = (Id)uVar1;
  if (!specConstant) {
    IVar3 = findScalarConstant(this,OpTypeFloat,opcode_00,IVar2,existing);
    if (IVar3 != 0) {
      return IVar3;
    }
    c._0_4_ = 0;
  }
  this_00 = (Instruction *)::operator_new(0x60);
  IVar3 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar3,IVar2,opcode_00);
  local_48 = this_00;
  spv::Instruction::addImmediateOperand(this_00,existing);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_50,
             local_48);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_50);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_50);
  local_54 = 0x16;
  this_01 = std::
            unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
            ::operator[](&this->groupedConstants,&local_54);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_01,&local_48)
  ;
  Module::mapInstruction(&this->module,local_48);
  IVar2 = spv::Instruction::getResultId(local_48);
  return IVar2;
}

Assistant:

Id Builder::makeFloat16Constant(float f16, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(16);

    spvutils::HexFloat<spvutils::FloatProxy<float>> fVal(f16);
    spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>> f16Val(0);
    fVal.castTo(f16Val, spvutils::kRoundToZero);

    unsigned value = f16Val.value().getAsFloat().get_value();

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (!specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}